

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_nim.cpp
# Opt level: O3

string * __thiscall
flatbuffers::anon_unknown_0::NimBfbsGenerator::AppendStructBuilderBody
          (string *__return_storage_ptr__,NimBfbsGenerator *this,Object *object,string *prefix)

{
  long *plVar1;
  undefined8 *puVar2;
  long *plVar3;
  ulong *puVar4;
  int iVar5;
  ulong uVar6;
  undefined8 uVar7;
  long *local_128;
  undefined8 local_120;
  long local_118;
  undefined8 uStack_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_108;
  ulong *local_100;
  long local_f8;
  ulong local_f0;
  long lStack_e8;
  string local_e0;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  NimBfbsGenerator *local_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  _Any_data local_78;
  string *local_68;
  code *pcStack_60;
  string local_50;
  
  local_108 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_108;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar5 = 0;
  if ((10 < *(ushort *)(object + -(long)*(int *)object)) &&
     ((ulong)*(ushort *)(object + (10 - (long)*(int *)object)) != 0)) {
    iVar5 = *(int *)(object + *(ushort *)(object + (10 - (long)*(int *)object)));
  }
  NumToString<int>(&local_50,iVar5);
  plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x3810de);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_88 = *plVar3;
    lStack_80 = plVar1[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *plVar3;
    local_98 = (long *)*plVar1;
  }
  local_90 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_98);
  puVar4 = (ulong *)(plVar1 + 2);
  if ((ulong *)*plVar1 == puVar4) {
    local_f0 = *puVar4;
    lStack_e8 = plVar1[3];
    local_100 = &local_f0;
  }
  else {
    local_f0 = *puVar4;
    local_100 = (ulong *)*plVar1;
  }
  local_f8 = plVar1[1];
  *plVar1 = (long)puVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  iVar5 = 0;
  if ((0xc < *(ushort *)(object + -(long)*(int *)object)) &&
     (iVar5 = 0, (ulong)*(ushort *)(object + (0xc - (long)*(int *)object)) != 0)) {
    iVar5 = *(int *)(object + *(ushort *)(object + (0xc - (long)*(int *)object)));
  }
  NumToString<int>(&local_e0,iVar5);
  uVar6 = 0xf;
  if (local_100 != &local_f0) {
    uVar6 = local_f0;
  }
  local_a0 = this;
  if (uVar6 < local_e0._M_string_length + local_f8) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      uVar7 = local_e0.field_2._M_allocated_capacity;
    }
    if (local_e0._M_string_length + local_f8 <= (ulong)uVar7) {
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,(ulong)local_100);
      goto LAB_0032aec1;
    }
  }
  puVar2 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_e0._M_dataplus._M_p);
LAB_0032aec1:
  local_128 = &local_118;
  plVar1 = puVar2 + 2;
  if ((long *)*puVar2 == plVar1) {
    local_118 = *plVar1;
    uStack_110 = puVar2[3];
  }
  else {
    local_118 = *plVar1;
    local_128 = (long *)*puVar2;
  }
  local_120 = puVar2[1];
  *puVar2 = plVar1;
  puVar2[1] = 0;
  *(undefined1 *)plVar1 = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_128);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_b0 = *plVar3;
    lStack_a8 = plVar1[3];
    local_c0 = &local_b0;
  }
  else {
    local_b0 = *plVar3;
    local_c0 = (long *)*plVar1;
  }
  local_b8 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_c0);
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128,local_118 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100,local_f0 + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_68 = (string *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = operator_new(0x18);
  *(string **)local_78._M_unused._0_8_ = __return_storage_ptr__;
  *(NimBfbsGenerator **)((long)local_78._M_unused._0_8_ + 8) = local_a0;
  *(string **)((long)local_78._M_unused._0_8_ + 0x10) = prefix;
  pcStack_60 = std::
               _Function_handler<void_(const_reflection::Field_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/bfbs_gen_nim.cpp:384:44)>
               ::_M_invoke;
  local_68 = (string *)
             std::
             _Function_handler<void_(const_reflection::Field_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/bfbs_gen_nim.cpp:384:44)>
             ::_M_manager;
  BaseBfbsGenerator::ForAllFields
            (&local_a0->super_BaseBfbsGenerator,object,true,
             (function<void_(const_reflection::Field_*)> *)&local_78);
  if (local_68 != (string *)0x0) {
    local_68 = (string *)(*(code *)local_68)(&local_78,&local_78,3);
  }
  return local_68;
}

Assistant:

std::string AppendStructBuilderBody(const r::Object *object,
                                      std::string prefix = "") const {
    std::string code;
    code += "  self.Prep(" + NumToString(object->minalign()) + ", " +
            NumToString(object->bytesize()) + ")\n";

    // We need to reverse the order we iterate over, since we build the
    // buffer backwards.
    ForAllFields(object, /*reverse=*/true, [&](const r::Field *field) {
      const int32_t num_padding_bytes = field->padding();
      if (num_padding_bytes) {
        code += "  self.Pad(" + NumToString(num_padding_bytes) + ")\n";
      }
      if (IsStructOrTable(field->type()->base_type())) {
        const r::Object *field_object = GetObject(field->type());
        code += AppendStructBuilderBody(field_object,
                                        prefix + namer_.Variable(*field) + "_");
      } else {
        code += "  self.Prepend(" + prefix + namer_.Variable(*field) + ")\n";
      }
    });

    return code;
  }